

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

void add_pax_attr_binary(archive_string *as,char *key,char *value,size_t value_len)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  char *p;
  uint uVar8;
  char tmp [13];
  char local_23 [3];
  
  sVar3 = strlen(key);
  uVar4 = (int)value_len + (int)sVar3 + 3;
  if ((int)uVar4 < 1) {
    iVar6 = 1;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar6 = 1;
    uVar8 = uVar4;
    do {
      iVar2 = iVar2 + 1;
      iVar6 = iVar6 * 10;
      bVar1 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar1);
  }
  local_23[2] = 0;
  uVar8 = (uint)(iVar6 <= (int)(iVar2 + uVar4)) + iVar2 + uVar4;
  uVar4 = -uVar8;
  if (0 < (int)uVar8) {
    uVar4 = uVar8;
  }
  uVar5 = (ulong)uVar4;
  pcVar7 = local_23 + 1;
  do {
    p = pcVar7;
    *p = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar5 % 10 + 0x35];
    pcVar7 = p + -1;
    bVar1 = 9 < uVar5;
    uVar5 = uVar5 / 10;
  } while (bVar1);
  if ((int)uVar8 < 0) {
    *pcVar7 = '-';
    p = pcVar7;
  }
  archive_strcat(as,p);
  archive_strappend_char(as,' ');
  archive_strcat(as,key);
  archive_strappend_char(as,'=');
  archive_array_append(as,value,value_len);
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
add_pax_attr_binary(struct archive_string *as, const char *key,
		    const char *value, size_t value_len)
{
	int digits, i, len, next_ten;
	char tmp[1 + 3 * sizeof(int)];	/* < 3 base-10 digits per byte */

	/*-
	 * PAX attributes have the following layout:
	 *     <len> <space> <key> <=> <value> <nl>
	 */
	len = 1 + (int)strlen(key) + 1 + (int)value_len + 1;

	/*
	 * The <len> field includes the length of the <len> field, so
	 * computing the correct length is tricky.  I start by
	 * counting the number of base-10 digits in 'len' and
	 * computing the next higher power of 10.
	 */
	next_ten = 1;
	digits = 0;
	i = len;
	while (i > 0) {
		i = i / 10;
		digits++;
		next_ten = next_ten * 10;
	}
	/*
	 * For example, if string without the length field is 99
	 * chars, then adding the 2 digit length "99" will force the
	 * total length past 100, requiring an extra digit.  The next
	 * statement adjusts for this effect.
	 */
	if (len + digits >= next_ten)
		digits++;

	/* Now, we have the right length so we can build the line. */
	tmp[sizeof(tmp) - 1] = 0;	/* Null-terminate the work area. */
	archive_strcat(as, format_int(tmp + sizeof(tmp) - 1, len + digits));
	archive_strappend_char(as, ' ');
	archive_strcat(as, key);
	archive_strappend_char(as, '=');
	archive_array_append(as, value, value_len);
	archive_strappend_char(as, '\n');
}